

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O3

bool __thiscall
World::collidesWithQuads(World *this,vector<Quad_*,_std::allocator<Quad_*>_> *quads,Vec2d *offset)

{
  Quad *this_00;
  int iVar1;
  Vec2d **ppVVar2;
  Vec2d *this_01;
  ostream *poVar3;
  pointer ppQVar4;
  long lVar5;
  float fVar6;
  string local_68;
  Vec2d *local_48;
  pointer local_40;
  float local_34;
  
  ppQVar4 = (quads->super__Vector_base<Quad_*,_std::allocator<Quad_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_40 = (quads->super__Vector_base<Quad_*,_std::allocator<Quad_*>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  local_48 = offset;
  if (ppQVar4 != local_40) {
    do {
      this_00 = *ppQVar4;
      iVar1 = Quad::getVertexCount(this_00);
      if (0 < iVar1) {
        lVar5 = 0;
        do {
          ppVVar2 = Quad::getVertices(this_00);
          this_01 = Vec2d::getOffset(ppVVar2[lVar5],local_48);
          fVar6 = Vec2d::getY(this_01);
          if (fVar6 < 0.0) {
LAB_0011b741:
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Collision with world ",0x15);
            Vec2d::toString_abi_cxx11_(&local_68,this_01);
            poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,local_68._M_dataplus._M_p,
                                local_68._M_string_length);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
            std::ostream::put((char)poVar3);
            std::ostream::flush();
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p);
            }
            operator_delete(this_01);
            return true;
          }
          local_34 = Vec2d::getY(this_01);
          fVar6 = Vec2d::getY(this->bounds);
          if ((fVar6 < local_34) || (fVar6 = Vec2d::getX(this_01), fVar6 < 0.0)) goto LAB_0011b741;
          local_34 = Vec2d::getX(this_01);
          fVar6 = Vec2d::getX(this->bounds);
          if (fVar6 < local_34) goto LAB_0011b741;
          operator_delete(this_01);
          lVar5 = lVar5 + 1;
          iVar1 = Quad::getVertexCount(this_00);
        } while (lVar5 < iVar1);
      }
      ppQVar4 = ppQVar4 + 1;
    } while (ppQVar4 != local_40);
  }
  return false;
}

Assistant:

bool World::collidesWithQuads(vector<Quad*>* quads, Vec2d* offset) {
    for (auto quad : *quads) {
        for (int i = 0; i < quad->getVertexCount(); i++) {
            Vec2d* vertex = quad->getVertices()[i]->getOffset(offset);
            if (vertex->getY() < 0 || vertex->getY() > bounds->getY() || vertex->getX() < 0 || vertex->getX() > bounds->getX()) {
                cout << "Collision with world " << vertex->toString() << endl;
                delete vertex;
                return true;
            }
            delete vertex;
        }
    }
    return false;
}